

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O2

int physics_thread_main(void *arg)

{
  undefined8 uVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  float dt;
  float fVar11;
  timespec local_40;
  
  do {
    mtx_lock(&thread_sync.particles_lock);
    while ((iVar3 = glfwWindowShouldClose((GLFWwindow *)arg), iVar3 == 0 &&
           (thread_sync.d_frame < thread_sync.p_frame))) {
      clock_gettime(0,&local_40);
      lVar5 = local_40.tv_nsec + 100000000;
      local_40.tv_nsec = lVar5 % 1000000000;
      local_40.tv_sec = local_40.tv_sec + lVar5 / 1000000000;
      cnd_timedwait(&thread_sync.d_done,&thread_sync.particles_lock,(timespec *)&local_40);
    }
    iVar3 = glfwWindowShouldClose((GLFWwindow *)arg);
    dVar2 = thread_sync.t;
    fVar7 = thread_sync.dt;
    if (iVar3 != 0) {
      return 0;
    }
    for (; 0.0 < fVar7; fVar7 = fVar7 - dt) {
      dt = fVar7;
      if (0.0013333333 <= fVar7) {
        dt = 0.0013333333;
      }
      for (lVar5 = 0; lVar5 != 0x203a0; lVar5 = lVar5 + 0x2c) {
        update_particle((PARTICLE *)((long)&particles[0].x + lVar5),dt);
      }
      fVar11 = min_age + dt;
      min_age = fVar11;
LAB_00116e94:
      if (0.0026666666 <= fVar11) {
        fVar11 = fVar11 + -0.0026666666;
        lVar5 = -0x2c;
        do {
          lVar6 = lVar5;
          min_age = fVar11;
          if (lVar6 + 0x2c == 0x203a0) goto LAB_00116e94;
          lVar5 = lVar6 + 0x2c;
        } while (*(int *)((long)&particles[1].active + lVar6) != 0);
        dVar8 = (double)fVar11 + dVar2;
        *(undefined8 *)((long)&particles[1].x + lVar6) = 0;
        *(undefined4 *)((long)&particles[1].z + lVar6) = 0x40400000;
        uVar4 = rand();
        *(float *)((long)&particles[1].vz + lVar6) = (float)(uVar4 & 0xfff) * 7.324219e-05 + 0.7;
        uVar4 = rand();
        dVar9 = (double)((float)(uVar4 & 0xfff) * 0.0015339808);
        dVar10 = cos(dVar9);
        *(float *)((long)&particles[1].vx + lVar6) = (float)dVar10 * 0.4;
        dVar9 = sin(dVar9);
        *(float *)((long)&particles[1].vy + lVar6) = (float)dVar9 * 0.4;
        dVar9 = sin(dVar8 * 0.5);
        dVar10 = sin(dVar8 * 1.31);
        fVar11 = ((float)(dVar10 + dVar9) * 0.1 + 0.8) * 8.0;
        uVar1 = *(undefined8 *)((long)&particles[1].vx + lVar6);
        *(ulong *)((long)&particles[1].vx + lVar6) =
             CONCAT44(fVar11 * (float)((ulong)uVar1 >> 0x20),fVar11 * (float)uVar1);
        *(float *)((long)&particles[1].vz + lVar6) =
             fVar11 * *(float *)((long)&particles[1].vz + lVar6);
        dVar9 = sin(dVar8 * 0.34 + 0.1);
        *(float *)((long)&particles[1].r + lVar6) = (float)dVar9 * 0.3 + 0.7;
        dVar9 = sin(dVar8 * 0.63 + 1.1);
        *(float *)((long)&particles[1].g + lVar6) = (float)dVar9 * 0.4 + 0.6;
        dVar9 = sin(dVar8 * 0.91 + 2.1);
        *(float *)((long)&particles[1].b + lVar6) = (float)dVar9 * 0.4 + 0.6;
        dVar9 = sin(dVar8 * 1.34);
        glow_pos[0] = (float)dVar9 * 0.4;
        dVar8 = sin(dVar8 * 3.11);
        glow_pos[1] = (float)dVar8 * 0.4;
        glow_pos[2] = 4.0;
        glow_pos[3] = 1.0;
        glow_color._0_8_ = *(undefined8 *)((long)&particles[1].r + lVar6);
        glow_color[2] = *(float *)((long)&particles[1].b + lVar6);
        glow_color[3] = 1.0;
        *(undefined8 *)((long)&particles[1].life + lVar6) = 0x13f800000;
        fVar11 = min_age;
        update_particle((PARTICLE *)((long)&particles[1].x + lVar6),min_age);
        goto LAB_00116e94;
      }
    }
    thread_sync.p_frame = thread_sync.p_frame + 1;
    mtx_unlock(&thread_sync.particles_lock);
    cnd_signal(&thread_sync.p_done);
  } while( true );
}

Assistant:

static int physics_thread_main(void* arg)
{
    GLFWwindow* window = arg;

    for (;;)
    {
        mtx_lock(&thread_sync.particles_lock);

        // Wait for particle drawing to be done
        while (!glfwWindowShouldClose(window) &&
               thread_sync.p_frame > thread_sync.d_frame)
        {
            struct timespec ts;
            clock_gettime(CLOCK_REALTIME, &ts);
            ts.tv_nsec += 100 * 1000 * 1000;
            ts.tv_sec += ts.tv_nsec / (1000 * 1000 * 1000);
            ts.tv_nsec %= 1000 * 1000 * 1000;
            cnd_timedwait(&thread_sync.d_done, &thread_sync.particles_lock, &ts);
        }

        if (glfwWindowShouldClose(window))
            break;

        // Update particles
        particle_engine(thread_sync.t, thread_sync.dt);

        // Update frame counter
        thread_sync.p_frame++;

        // Unlock mutex and signal drawing thread
        mtx_unlock(&thread_sync.particles_lock);
        cnd_signal(&thread_sync.p_done);
    }

    return 0;
}